

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyTypeUrl
          (ParserImpl *this,string *full_type_name,string *prefix)

{
  bool bVar1;
  string *in_RDX;
  string url;
  string *in_stack_ffffffffffffff10;
  allocator *paVar2;
  ParserImpl *in_stack_ffffffffffffff18;
  allocator local_c1;
  string *in_stack_ffffffffffffff40;
  ParserImpl *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string local_a0 [32];
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar3;
  ParserImpl *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffffb0;
  ParserImpl *in_stack_ffffffffffffffb8;
  string *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  bVar1 = ConsumeIdentifier(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (bVar1) {
    while( true ) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffc0,".",(allocator *)&stack0xffffffffffffffbf);
      bVar1 = TryConsume(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
      if (!bVar1) break;
      in_stack_ffffffffffffff18 = (ParserImpl *)&stack0xffffffffffffff88;
      std::__cxx11::string::string((string *)in_stack_ffffffffffffff18);
      bVar1 = ConsumeIdentifier(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      if (bVar1) {
        std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        std::__cxx11::string::operator+=(local_20,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
      else {
        local_1 = 0;
      }
      uVar3 = (uint)!bVar1;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
      if (uVar3 != 0) goto LAB_0045949b;
      in_stack_ffffffffffffff84 = 0;
    }
    paVar2 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff40,"/",paVar2);
    bVar1 = Consume(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    if (bVar1) {
      std::__cxx11::string::operator+=(local_20,"/");
      bVar1 = ConsumeFullTypeName(in_stack_ffffffffffffff88,
                                  (string *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (bVar1) {
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_0045949b:
  return (bool)(local_1 & 1);
}

Assistant:

bool ConsumeAnyTypeUrl(std::string* full_type_name, std::string* prefix) {
    // TODO(saito) Extend Consume() to consume multiple tokens at once, so that
    // this code can be written as just DO(Consume(kGoogleApisTypePrefix)).
    DO(ConsumeIdentifier(prefix));
    while (TryConsume(".")) {
      std::string url;
      DO(ConsumeIdentifier(&url));
      *prefix += "." + url;
    }
    DO(Consume("/"));
    *prefix += "/";
    DO(ConsumeFullTypeName(full_type_name));

    return true;
  }